

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,
          constraint_t<is_convertible<io_context_&,_execution_context_&>::value> param_3)

{
  implementation_type *__file;
  error_code ec;
  protocol_type protocol;
  error_code local_38;
  int local_24;
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  local_24 = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  __file = &(this->impl_).implementation_;
  detail::reactive_socket_service<asio::ip::udp>::open
            ((this->impl_).service_,(char *)__file,(int)&local_24,&local_38);
  detail::throw_error(&local_38,"open");
  detail::reactive_socket_service<asio::ip::udp>::bind
            ((this->impl_).service_,(int)__file,(sockaddr *)endpoint,(socklen_t)&local_38);
  detail::throw_error(&local_38,"bind");
  return;
}

Assistant:

basic_socket(ExecutionContext& context, const endpoint_type& endpoint,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value
      > = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }